

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

void Sbd_ManMergeTest(Sbd_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int Node;
  int v;
  
  for (v = 0; v < p->pGia->nObjs; v = v + 1) {
    pGVar2 = Gia_ManObj(p->pGia,v);
    if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
      Sbd_ManMergeCuts(p,v);
    }
  }
  uVar1 = Sbd_ManDelay(p);
  printf("Delay %d.\n",(ulong)uVar1);
  return;
}

Assistant:

void Sbd_ManMergeTest( Sbd_Man_t * p )
{
    int Node;
    Gia_ManForEachAndId( p->pGia, Node )
        Sbd_ManMergeCuts( p, Node );
    printf( "Delay %d.\n", Sbd_ManDelay(p) );
}